

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::InsertSyntheticTestCase(string *name,CodeLocation *location,bool has_test_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  char *pcVar4;
  pointer pcVar5;
  UnitTestImpl *pUVar6;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  const_iterator cVar9;
  long *plVar10;
  TestFactoryBase *factory;
  long *plVar11;
  size_type *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  string full_name;
  string message;
  char kMissingTestCase [348];
  char kMissingInstantiation [378];
  allocator local_439;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  TestFactoryBase *local_418;
  undefined8 local_410;
  TestFactoryBase local_408;
  _func_int **pp_Stack_400;
  int local_3f8;
  long *local_3f0;
  long local_3e8;
  long local_3e0;
  long lStack_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  CodeLocation local_3b0;
  long *local_388;
  long local_380;
  long local_378;
  long lStack_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_368;
  _func_int **local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  TestFactoryBase *local_348;
  _func_int **local_340;
  TestFactoryBase local_338;
  _func_int **pp_Stack_330;
  int local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_320;
  undefined1 local_318 [352];
  undefined1 local_1b8 [392];
  
  UnitTest::GetInstance();
  pUVar6 = UnitTest::GetInstance::instance.impl_;
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&((UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_)._M_t
                 ,name);
  if ((_Rb_tree_header *)cVar9._M_node ==
      &(pUVar6->ignored_parameterized_test_suites_)._M_t._M_impl.super__Rb_tree_header) {
    memcpy(local_1b8,
           " is defined via TEST_P, but never instantiated. None of the test cases will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only ones provided expand to nothing.\n\nIdeally, TEST_P definitions should only ever be included as part of binaries that intend to use them. (As opposed to, for example, being placed in a library that may be linked in to get other utilities.)"
           ,0x17a);
    memcpy(local_318,
           " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are defined via TEST_P . No test cases will run.\n\nIdeally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from code that always depend on code that provides TEST_P. Failing to do so is often an indication of dead code, e.g. the last TEST_P was removed but the rest got left behind."
           ,0x15c);
    std::operator+(&local_3d0,"Parameterized test suite ",name);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_3d0);
    plVar11 = plVar10 + 2;
    if ((long *)*plVar10 == plVar11) {
      local_3e0 = *plVar11;
      lStack_3d8 = plVar10[3];
      local_3f0 = &local_3e0;
    }
    else {
      local_3e0 = *plVar11;
      local_3f0 = (long *)*plVar10;
    }
    local_3e8 = plVar10[1];
    *plVar10 = (long)plVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_3f0);
    paVar2 = &local_3b0.file.field_2;
    psVar12 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_3b0.file.field_2._M_allocated_capacity = *psVar12;
      local_3b0.file.field_2._8_8_ = plVar10[3];
      local_3b0.file._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_3b0.file.field_2._M_allocated_capacity = *psVar12;
      local_3b0.file._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_3b0.file._M_string_length = plVar10[1];
    *plVar10 = (long)psVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_3b0,(ulong)(name->_M_dataplus)._M_p);
    paVar1 = &local_438.field_2;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 == paVar13) {
      local_438.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_438.field_2._8_8_ = plVar10[3];
      local_438._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_438.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_438._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_438._M_string_length = plVar10[1];
    *plVar10 = (long)paVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_438);
    local_388 = &local_378;
    plVar11 = plVar10 + 2;
    if ((long *)*plVar10 == plVar11) {
      local_378 = *plVar11;
      lStack_370 = plVar10[3];
    }
    else {
      local_378 = *plVar11;
      local_388 = (long *)*plVar10;
    }
    local_380 = plVar10[1];
    *plVar10 = (long)plVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != paVar1) {
      operator_delete(local_438._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0.file._M_dataplus._M_p != paVar2) {
      operator_delete(local_3b0.file._M_dataplus._M_p);
    }
    if (local_3f0 != &local_3e0) {
      operator_delete(local_3f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p);
    }
    std::operator+(&local_438,"UninstantiatedParameterizedTestSuite<",name);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_438);
    psVar12 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_3d0.field_2._M_allocated_capacity = *psVar12;
      local_3d0.field_2._8_8_ = plVar10[3];
      local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
    }
    else {
      local_3d0.field_2._M_allocated_capacity = *psVar12;
      local_3d0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_3d0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != paVar1) {
      operator_delete(local_438._M_dataplus._M_p);
    }
    local_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0._M_dataplus._M_p;
    pcVar4 = (location->file)._M_dataplus._M_p;
    iVar3 = location->line;
    local_368 = &local_358;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_368,local_388,local_380 + (long)local_388);
    pcVar5 = (location->file)._M_dataplus._M_p;
    local_348 = &local_338;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,pcVar5,pcVar5 + (location->file)._M_string_length);
    local_328 = location->line;
    std::__cxx11::string::string((string *)&local_3f0,pcVar4,&local_439);
    local_3b0.file._M_dataplus._M_p = (pointer)&local_3b0.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3b0,local_3f0,local_3e8 + (long)local_3f0);
    local_3b0.line = iVar3;
    factory = (TestFactoryBase *)operator_new(0x50);
    pp_Var8 = local_340;
    pp_Var7 = local_360;
    if (local_368 == &local_358) {
      local_438.field_2._8_8_ = local_358._8_8_;
      local_438._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_438._M_dataplus._M_p = (pointer)local_368;
    }
    local_438.field_2._M_allocated_capacity._1_7_ = local_358._M_allocated_capacity._1_7_;
    local_438.field_2._M_local_buf[0] = local_358._M_local_buf[0];
    local_360 = (_func_int **)0x0;
    local_358._M_local_buf[0] = '\0';
    if (local_348 == &local_338) {
      pp_Stack_400 = pp_Stack_330;
      local_418 = &local_408;
    }
    else {
      local_418 = local_348;
    }
    local_408._vptr_TestFactoryBase._1_7_ = local_338._vptr_TestFactoryBase._1_7_;
    local_408._vptr_TestFactoryBase._0_1_ = local_338._vptr_TestFactoryBase._0_1_;
    local_340 = (_func_int **)0x0;
    local_338._vptr_TestFactoryBase._0_1_ = 0;
    local_3f8 = local_328;
    factory->_vptr_TestFactoryBase =
         (_func_int **)
         (
         _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal23InsertSyntheticTestCaseERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEENS2_12CodeLocationEbE3__0EEPNS_8TestInfoEPKcSG_SG_SG_SG_iT0_E11FactoryImpl
         + 0x10);
    factory[1]._vptr_TestFactoryBase = (_func_int **)(factory + 3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p == paVar1) {
      factory[3]._vptr_TestFactoryBase = (_func_int **)local_438.field_2._M_allocated_capacity;
      factory[4]._vptr_TestFactoryBase = (_func_int **)local_438.field_2._8_8_;
    }
    else {
      factory[1]._vptr_TestFactoryBase = (_func_int **)local_438._M_dataplus._M_p;
      factory[3]._vptr_TestFactoryBase = (_func_int **)local_438.field_2._M_allocated_capacity;
    }
    factory[2]._vptr_TestFactoryBase = pp_Var7;
    local_438._M_string_length = 0;
    local_438.field_2._M_allocated_capacity =
         (ulong)(uint7)local_358._M_allocated_capacity._1_7_ << 8;
    factory[5]._vptr_TestFactoryBase = (_func_int **)(factory + 7);
    if (local_418 == &local_408) {
      factory[7]._vptr_TestFactoryBase = local_408._vptr_TestFactoryBase;
      factory[8]._vptr_TestFactoryBase = pp_Stack_400;
    }
    else {
      factory[5]._vptr_TestFactoryBase = (_func_int **)local_418;
      factory[7]._vptr_TestFactoryBase = local_408._vptr_TestFactoryBase;
    }
    factory[6]._vptr_TestFactoryBase = pp_Var8;
    local_410 = 0;
    local_408._vptr_TestFactoryBase =
         (_func_int **)((ulong)local_338._vptr_TestFactoryBase._1_7_ << 8);
    *(int *)&factory[9]._vptr_TestFactoryBase = local_328;
    local_438._M_dataplus._M_p = (pointer)paVar1;
    local_418 = &local_408;
    local_368 = &local_358;
    local_348 = &local_338;
    MakeAndRegisterTestInfo
              ("GoogleTestVerification",local_320->_M_local_buf,(char *)0x0,(char *)0x0,&local_3b0,
               &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
               (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
    if (local_418 != &local_408) {
      operator_delete(local_418);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != paVar1) {
      operator_delete(local_438._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0.file._M_dataplus._M_p != &local_3b0.file.field_2) {
      operator_delete(local_3b0.file._M_dataplus._M_p);
    }
    if (local_3f0 != &local_3e0) {
      operator_delete(local_3f0);
    }
    if (local_348 != &local_338) {
      operator_delete(local_348);
    }
    if (local_368 != &local_358) {
      operator_delete(local_368);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p);
    }
    if (local_388 != &local_378) {
      operator_delete(local_388);
    }
  }
  return;
}

Assistant:

void InsertSyntheticTestCase(const std::string& name, CodeLocation location,
                             bool has_test_p) {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  if (ignored.find(name) != ignored.end()) return;

  const char kMissingInstantiation[] =  //
      " is defined via TEST_P, but never instantiated. None of the test cases "
      "will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only "
      "ones provided expand to nothing."
      "\n\n"
      "Ideally, TEST_P definitions should only ever be included as part of "
      "binaries that intend to use them. (As opposed to, for example, being "
      "placed in a library that may be linked in to get other utilities.)";

  const char kMissingTestCase[] =  //
      " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are "
      "defined via TEST_P . No test cases will run."
      "\n\n"
      "Ideally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from "
      "code that always depend on code that provides TEST_P. Failing to do "
      "so is often an indication of dead code, e.g. the last TEST_P was "
      "removed but the rest got left behind.";

  std::string message =
      "Parameterized test suite " + name +
      (has_test_p ? kMissingInstantiation : kMissingTestCase) +
      "\n\n"
      "To suppress this error for this test suite, insert the following line "
      "(in a non-header) in the namespace it is defined in:"
      "\n\n"
      "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" + name + ");";

  std::string full_name = "UninstantiatedParameterizedTestSuite<" + name + ">";
  RegisterTest(  //
      "GoogleTestVerification", full_name.c_str(),
      nullptr,  // No type parameter.
      nullptr,  // No value parameter.
      location.file.c_str(), location.line, [message, location] {
        return new FailureTest(location, message,
                               kErrorOnUninstantiatedParameterizedTest);
      });
}